

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionTestCase.cpp
# Opt level: O2

void __thiscall
SuiteSessionTests::acceptorT11FixturenextResendRequestT1150RepeatingGroupHelper::RunImpl
          (acceptorT11FixturenextResendRequestT1150RepeatingGroupHelper *this)

{
  undefined1 *this_00;
  Message *pMVar1;
  TestResults *pTVar2;
  char cVar3;
  TestResults **ppTVar4;
  TestDetails **ppTVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3c0;
  OrigSendingTime origSendingTime;
  TestDetails local_340;
  PossDupFlag possDupFlag;
  SendingTime sendingTime;
  Message message;
  FieldMap local_f8 [232];
  
  pMVar1 = (Message *)(this->super_acceptorT11Fixture).super_sessionT11Fixture.object;
  createT11Logon((Logon *)&message,"ISLD","TW",1);
  FIX::UtcTimeStamp::UtcTimeStamp((UtcTimeStamp *)&possDupFlag);
  FIX::Session::next(pMVar1,(UtcTimeStamp *)&message,SUB81(&possDupFlag,0));
  FIX::Message::~Message(&message);
  createT1150ExecutionReport((ExecutionReport *)&possDupFlag,"ISLD","TW",2);
  FIX::Message::Message(&message,(Message *)&possDupFlag);
  FIX::Message::~Message((Message *)&possDupFlag);
  cVar3 = FIX::Session::send((Message *)
                             (this->super_acceptorT11Fixture).super_sessionT11Fixture.object);
  if (cVar3 == '\0') {
    ppTVar4 = UnitTest::CurrentTest::Results();
    pTVar2 = *ppTVar4;
    ppTVar5 = UnitTest::CurrentTest::Details();
    UnitTest::TestDetails::TestDetails((TestDetails *)&possDupFlag,*ppTVar5,0x502);
    UnitTest::TestResults::OnTestFailure
              (pTVar2,(TestDetails *)&possDupFlag,"object->send( message )");
  }
  pMVar1 = (Message *)(this->super_acceptorT11Fixture).super_sessionT11Fixture.object;
  createT11ResendRequest((ResendRequest *)&possDupFlag,"ISLD","TW",3,2,2);
  FIX::UtcTimeStamp::UtcTimeStamp((UtcTimeStamp *)&origSendingTime);
  FIX::Session::next(pMVar1,(UtcTimeStamp *)&possDupFlag,SUB81(&origSendingTime,0));
  FIX::Message::~Message((Message *)&possDupFlag);
  FIX::PossDupFlag::PossDupFlag(&possDupFlag);
  FIX::OrigSendingTime::OrigSendingTime(&origSendingTime);
  FIX::SendingTime::SendingTime(&sendingTime);
  this_00 = &(this->super_acceptorT11Fixture).super_sessionT11Fixture.super_TestCallback.field_0xe0;
  FIX::FieldMap::getField((FieldMap *)this_00,(FieldBase *)&possDupFlag);
  FIX::FieldMap::getField((FieldMap *)this_00,(FieldBase *)&origSendingTime);
  FIX::FieldMap::getField((FieldMap *)this_00,(FieldBase *)&sendingTime);
  FIX::FieldMap::setField(local_f8,(FieldBase *)&possDupFlag,true);
  FIX::FieldMap::setField(local_f8,(FieldBase *)&origSendingTime,true);
  FIX::FieldMap::setField(local_f8,(FieldBase *)&sendingTime,true);
  ppTVar4 = UnitTest::CurrentTest::Results();
  pTVar2 = *ppTVar4;
  FIX::Message::toString_abi_cxx11_((int)&local_3e0,(int)&message,8);
  FIX::Message::toString_abi_cxx11_((int)&local_3c0,(int)this + 0x70,8);
  ppTVar5 = UnitTest::CurrentTest::Details();
  UnitTest::TestDetails::TestDetails(&local_340,*ppTVar5,0x50e);
  UnitTest::CheckEqual<std::__cxx11::string,std::__cxx11::string>
            (pTVar2,&local_3e0,&local_3c0,&local_340);
  std::__cxx11::string::~string((string *)&local_3c0);
  std::__cxx11::string::~string((string *)&local_3e0);
  FIX::FieldBase::~FieldBase((FieldBase *)&sendingTime);
  FIX::FieldBase::~FieldBase((FieldBase *)&origSendingTime);
  FIX::FieldBase::~FieldBase((FieldBase *)&possDupFlag);
  FIX::Message::~Message(&message);
  return;
}

Assistant:

TEST_FIXTURE(acceptorT11Fixture, nextResendRequestT1150RepeatingGroup)
{
  object->next( createT11Logon( "ISLD", "TW", 1 ), UtcTimeStamp() );
  FIX::Message message = createT1150ExecutionReport( "ISLD", "TW", 2 );
  CHECK( object->send( message ) );
  object->next( createT11ResendRequest( "ISLD", "TW", 3, 2, 2 ), UtcTimeStamp() );

  PossDupFlag possDupFlag;
  OrigSendingTime origSendingTime;
  SendingTime sendingTime;
  lastResent.getHeader().getField( possDupFlag );
  lastResent.getHeader().getField( origSendingTime );
  lastResent.getHeader().getField( sendingTime );
  message.getHeader().setField( possDupFlag );
  message.getHeader().setField( origSendingTime );
  message.getHeader().setField( sendingTime );
  CHECK_EQUAL( message.toString(), lastResent.toString() );
}